

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O2

void __thiscall
CompositedBupOutputter::newMouth
          (CompositedBupOutputter *this,Image *img,Point pos,int num,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  _Vector_base<MaskRect,_std::allocator<MaskRect>_> _Stack_a8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Image::operator=(&this->withMouth,&this->withFace);
  std::operator+(&local_70,&this->withFaceName,"_");
  std::__cxx11::to_string(&local_90,num);
  std::operator+(&local_50,&local_70,&local_90);
  std::__cxx11::string::operator=((string *)&this->withMouthName,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
            ((vector<MaskRect,_std::allocator<MaskRect>_> *)&_Stack_a8,mask);
  Image::drawOnto(img,&this->withMouth,pos,(vector<MaskRect,_std::allocator<MaskRect>_> *)&_Stack_a8
                 );
  std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base(&_Stack_a8);
  return;
}

Assistant:

void newMouth(const Image& img, Point pos, int num, const std::vector<MaskRect>& mask) override {
		withMouth = withFace;
		withMouthName = withFaceName + "_" + std::to_string(num);
		img.drawOnto(withMouth, pos, mask);
	}